

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::~QMenu(QMenu *this)

{
  byte bVar1;
  long lVar2;
  Span *pSVar3;
  Entry *pEVar4;
  QWidget *widget;
  ulong uVar5;
  long in_FS_OFFSET;
  piter local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007d0e98;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QMenu_007d1050;
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(long *)(lVar2 + 0x270) != 0) && (*(long *)(*(long *)(lVar2 + 0x270) + 8) != 0)) {
    local_30 = (piter)QHash<QAction_*,_QWidget_*>::begin
                                ((QHash<QAction_*,_QWidget_*> *)(lVar2 + 0x270));
    while( true ) {
      if (local_30.d == (Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> *)0x0 &&
          local_30.bucket == 0) break;
      pSVar3 = (local_30.d)->spans;
      uVar5 = local_30.bucket >> 7;
      pEVar4 = pSVar3[uVar5].entries;
      bVar1 = pSVar3[uVar5].offsets[(uint)local_30.bucket & 0x7f];
      widget = *(QWidget **)(pEVar4[bVar1].storage.data + 8);
      if (widget != (QWidget *)0x0) {
        QWidgetAction::releaseWidget(*(QWidgetAction **)pEVar4[bVar1].storage.data,widget);
        pEVar4 = (local_30.d)->spans[local_30.bucket >> 7].entries +
                 (local_30.d)->spans[local_30.bucket >> 7].offsets[(uint)local_30.bucket & 0x7f];
        (pEVar4->storage).data[8] = '\0';
        (pEVar4->storage).data[9] = '\0';
        (pEVar4->storage).data[10] = '\0';
        (pEVar4->storage).data[0xb] = '\0';
        (pEVar4->storage).data[0xc] = '\0';
        (pEVar4->storage).data[0xd] = '\0';
        (pEVar4->storage).data[0xe] = '\0';
        (pEVar4->storage).data[0xf] = '\0';
      }
      QHashPrivate::iterator<QHashPrivate::Node<QAction_*,_QWidget_*>_>::operator++(&local_30);
    }
  }
  if (*(long *)(lVar2 + 0x2b0) != 0) {
    QEventLoop::exit((int)*(long *)(lVar2 + 0x2b0));
  }
  hideTearOffMenu(this);
  QWidget::~QWidget(&this->super_QWidget);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMenu::~QMenu()
{
    Q_D(QMenu);
    if (!d->widgetItems.isEmpty()) {  // avoid detach on shared null hash
        QHash<QAction *, QWidget *>::iterator it = d->widgetItems.begin();
        for (; it != d->widgetItems.end(); ++it) {
            if (QWidget *widget = it.value()) {
                QWidgetAction *action = static_cast<QWidgetAction *>(it.key());
                action->releaseWidget(widget);
                *it = 0;
            }
        }
    }

    if (d->eventLoop)
        d->eventLoop->exit();
    hideTearOffMenu();
}